

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedMachine.hpp
# Opt level: O1

void __thiscall
MachineTypes::TimedMachine::set_speed_multiplier(TimedMachine *this,double multiplier)

{
  undefined8 *puVar1;
  long *plVar2;
  
  if ((this->speed_multiplier_ != multiplier) || (NAN(this->speed_multiplier_) || NAN(multiplier)))
  {
    this->speed_multiplier_ = multiplier;
    puVar1 = (undefined8 *)
             __dynamic_cast(this,&typeinfo,&AudioProducer::typeinfo,0xfffffffffffffffe);
    if (puVar1 != (undefined8 *)0x0) {
      plVar2 = (long *)(**(code **)*puVar1)(puVar1);
      if (plVar2 != (long *)0x0) {
        *(float *)((long)plVar2 + 0x14) = (float)multiplier;
        (**(code **)(*plVar2 + 0x30))
                  (*(float *)(plVar2 + 3) / (float)multiplier,plVar2,
                   *(undefined4 *)((long)plVar2 + 0x1c),*(byte *)(plVar2 + 4) & 1,
                   *(byte *)(plVar2 + 4),*(code **)(*plVar2 + 0x30));
        return;
      }
    }
  }
  return;
}

Assistant:

virtual void set_speed_multiplier(double multiplier) {
			if(speed_multiplier_ == multiplier) {
				return;
			}

			speed_multiplier_ = multiplier;

			auto audio_producer = dynamic_cast<AudioProducer *>(this);
			if(!audio_producer) return;

			auto speaker = audio_producer->get_speaker();
			if(speaker) {
				speaker->set_input_rate_multiplier(float(multiplier));
			}
		}